

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O2

void __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
::evalIntegrand(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
                *this,GpuArray<double,_3U> x,Real w)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  EBPlane *pEVar6;
  QuadratureRule *pQVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int j;
  ulong uVar11;
  ulong uVar12;
  int dim_1;
  long lVar13;
  int dim;
  long lVar14;
  bool bVar15;
  double c;
  double dVar16;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double local_58 [4];
  Real *local_38;
  GpuArray<double,_4U> roots;
  
  local_58[0] = -0.5;
  pEVar6 = this->phi;
  iVar4 = this->e0;
  dVar2 = (pEVar6->norm).arr[iVar4];
  uVar5 = this->psiCount;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    uVar9 = 0;
    uVar10 = 0;
    if (0 < (int)uVar5) {
      uVar10 = (ulong)uVar5;
    }
    uVar8 = 1;
    for (; dVar16 = local_58[1], uVar9 != uVar10; uVar9 = uVar9 + 1) {
      for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
        if ((this->free).arr[lVar14] == false) {
          (&stack0x00000008)[lVar14] =
               (double)*(undefined8 *)
                        (&DAT_0060a6e0 +
                        (ulong)(((this->psi).arr[uVar9].bits >> ((uint)lVar14 & 0x1f) & 1) == 0) * 8
                        );
        }
      }
      (&stack0x00000008)[iVar4] = -0.5;
      dVar16 = -0.5 - ((in_stack_00000018 - (pEVar6->cent).arr[2]) * (pEVar6->norm).arr[2] +
                      (in_stack_00000008 - (pEVar6->cent).arr[0]) * (pEVar6->norm).arr[0] +
                      (in_stack_00000010 - (pEVar6->cent).arr[1]) * (pEVar6->norm).arr[1]) / dVar2;
      if (ABS(dVar16) < 0.5) {
        lVar14 = (long)(int)uVar8;
        uVar8 = uVar8 + 1;
        local_58[lVar14] = dVar16;
      }
    }
    if (uVar8 == 3) {
      uVar8 = 3;
      if (local_58[2] < local_58[1]) {
        local_58[1] = local_58[2];
        local_58[2] = dVar16;
      }
    }
  }
  else {
    uVar8 = 1;
  }
  local_58[(int)uVar8] = 0.5;
  pQVar7 = this->f;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
  }
  local_38 = &(pQVar7->nodes).arr[0].w;
  uVar10 = 0;
  while (uVar10 != uVar9) {
    uVar12 = uVar10 + 1;
    dVar2 = local_58[uVar10];
    lVar14 = uVar10 + 1;
    dVar16 = local_58[lVar14] - dVar2;
    uVar10 = uVar12;
    if (1.1102230246251565e-14 <= dVar16) {
      (&stack0x00000008)[iVar4] = (local_58[lVar14] + dVar2) * 0.5;
      bVar15 = true;
      for (lVar14 = 0; (bVar15 && (lVar14 < (int)uVar5)); lVar14 = lVar14 + 1) {
        for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
          if ((this->free).arr[lVar13] == false) {
            (&stack0x00000008)[lVar13] =
                 (double)*(undefined8 *)
                          (&DAT_0060a6e0 +
                          (ulong)(((this->psi).arr[lVar14].bits >> ((uint)lVar13 & 0x1f) & 1) == 0)
                          * 8);
          }
        }
        bVar15 = (byte)((this->psi).arr[lVar14].bits & 0x18) !=
                 (byte)(((in_stack_00000018 - (pEVar6->cent).arr[2]) * (pEVar6->norm).arr[2] +
                         (in_stack_00000008 - (pEVar6->cent).arr[0]) * (pEVar6->norm).arr[0] +
                         (in_stack_00000010 - (pEVar6->cent).arr[1]) * (pEVar6->norm).arr[1] <= 0.0)
                       * '\x10');
      }
      if (bVar15) {
        uVar11 = (ulong)pQVar7->nnodes;
        uVar12 = uVar11;
        for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 8) {
          (&stack0x00000008)[iVar4] = *(double *)((long)&DAT_00622f90 + lVar14) * dVar16 + dVar2;
          dVar3 = *(double *)((long)&DAT_00622fb0 + lVar14);
          pdVar1 = (double *)((long)local_38 + lVar14 * 4 + uVar11 * 0x20 + -0x18);
          *pdVar1 = in_stack_00000008;
          pdVar1[1] = in_stack_00000010;
          *(double *)((long)local_38 + lVar14 * 4 + uVar11 * 0x20 + -8) = in_stack_00000018;
          *(double *)((long)local_38 + lVar14 * 4 + uVar11 * 0x20) = dVar3 * dVar16 * w;
          uVar12 = (ulong)((int)uVar12 + 1);
        }
        pQVar7->nnodes = (int)uVar12;
      }
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }